

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

sysbvm_tuple_t sysbvm_environment_createDefaultForEvaluation(sysbvm_context_t *context)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t analysisQueue;
  sysbvm_context_t *context_local;
  
  sVar1 = sysbvm_environment_getIntrinsicsBuiltInEnvironment(context);
  analysisQueue = sysbvm_analysisQueue_getDefault(context);
  sVar1 = sysbvm_environment_createWithAnalysisQueue(context,sVar1,analysisQueue);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_environment_createDefaultForEvaluation(sysbvm_context_t *context)
{
    return sysbvm_environment_createWithAnalysisQueue(context,
        sysbvm_environment_getIntrinsicsBuiltInEnvironment(context),
        sysbvm_analysisQueue_getDefault(context));
}